

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O2

int archive_read_format_cpio_read_header(archive_read *a,archive_entry *entry)

{
  void *pvVar1;
  long lVar2;
  long *plVar3;
  int iVar4;
  wchar_t wVar5;
  mode_t mVar6;
  int iVar7;
  uint uVar8;
  archive_string_conv *sc;
  char *pcVar9;
  int *piVar10;
  char *pcVar11;
  dev_t dVar12;
  la_int64_t lVar13;
  long *plVar14;
  long *plVar15;
  size_t namelength;
  size_t name_pad;
  
  pvVar1 = a->format->data;
  sc = *(archive_string_conv **)((long)pvVar1 + 0x38);
  if (sc == (archive_string_conv *)0x0) {
    if (*(int *)((long)pvVar1 + 0x48) == 0) {
      sc = archive_string_default_conversion_for_read((archive_conflict *)a);
      *(archive_string_conv **)((long)pvVar1 + 0x40) = sc;
      *(undefined4 *)((long)pvVar1 + 0x48) = 1;
    }
    else {
      sc = *(archive_string_conv **)((long)pvVar1 + 0x40);
    }
  }
  iVar4 = (**(code **)((long)pvVar1 + 8))(a,pvVar1,entry,&namelength,&name_pad);
  if (iVar4 < -0x14) {
    return iVar4;
  }
  pcVar9 = (char *)__archive_read_ahead(a,name_pad + namelength,(ssize_t *)0x0);
  if (pcVar9 == (char *)0x0) {
    return -0x1e;
  }
  wVar5 = _archive_entry_copy_pathname_l(entry,pcVar9,namelength,sc);
  if (wVar5 != L'\0') {
    piVar10 = __errno_location();
    if (*piVar10 == 0xc) {
      pcVar9 = "Can\'t allocate memory for Pathname";
      goto LAB_001322ed;
    }
    iVar4 = -0x14;
    pcVar11 = archive_string_conversion_charset_name(sc);
    archive_set_error(&a->archive,0x54,"Pathname can\'t be converted from %s to current locale.",
                      pcVar11);
  }
  *(undefined8 *)((long)pvVar1 + 0x28) = 0;
  __archive_read_consume(a,name_pad + namelength);
  mVar6 = archive_entry_filetype(entry);
  if (mVar6 == 0xa000) {
    if (0x100000 < (long)*(size_t *)((long)pvVar1 + 0x18)) {
      pcVar9 = "Rejecting malformed cpio archive: symlink contents exceed 1 megabyte";
LAB_001322ed:
      archive_set_error(&a->archive,0xc,pcVar9);
      return -0x1e;
    }
    pcVar11 = (char *)__archive_read_ahead(a,*(size_t *)((long)pvVar1 + 0x18),(ssize_t *)0x0);
    if (pcVar11 == (char *)0x0) {
      return -0x1e;
    }
    wVar5 = _archive_entry_copy_symlink_l(entry,pcVar11,*(size_t *)((long)pvVar1 + 0x18),sc);
    if (wVar5 != L'\0') {
      piVar10 = __errno_location();
      if (*piVar10 == 0xc) {
        pcVar9 = "Can\'t allocate memory for Linkname";
        goto LAB_001322ed;
      }
      pcVar11 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Linkname can\'t be converted from %s to current locale.",
                        pcVar11);
      iVar4 = -0x14;
    }
    __archive_read_consume(a,*(int64_t *)((long)pvVar1 + 0x18));
    *(undefined8 *)((long)pvVar1 + 0x18) = 0;
  }
  if ((namelength == 0xb) && (iVar7 = strncmp(pcVar9,"TRAILER!!!",10), iVar7 == 0)) {
    archive_clear_error(&a->archive);
    return 1;
  }
  uVar8 = archive_entry_nlink(entry);
  if (uVar8 < 2) {
    return iVar4;
  }
  dVar12 = archive_entry_dev(entry);
  lVar13 = archive_entry_ino64(entry);
  plVar15 = (long *)((long)pvVar1 + 0x10);
  plVar14 = plVar15;
  while (plVar14 = (long *)*plVar14, plVar14 != (long *)0x0) {
    if ((plVar14[3] == dVar12) && (plVar14[4] == lVar13)) {
      archive_entry_copy_hardlink(entry,(char *)plVar14[5]);
      plVar3 = plVar14 + 2;
      *(int *)plVar3 = (int)*plVar3 + -1;
      if ((int)*plVar3 == 0) {
        lVar2 = *plVar14;
        plVar3 = (long *)plVar14[1];
        if (plVar3 != (long *)0x0) {
          *plVar3 = lVar2;
        }
        if (lVar2 != 0) {
          *(long **)(lVar2 + 8) = plVar3;
        }
        if ((long *)*plVar15 == plVar14) {
          *plVar15 = lVar2;
        }
        free((void *)plVar14[5]);
        free(plVar14);
        return iVar4;
      }
      return iVar4;
    }
  }
  plVar14 = (long *)malloc(0x30);
  if (plVar14 != (long *)0x0) {
    lVar2 = *plVar15;
    if (lVar2 != 0) {
      *(long **)(lVar2 + 8) = plVar14;
    }
    *plVar14 = lVar2;
    plVar14[1] = 0;
    *plVar15 = (long)plVar14;
    plVar14[3] = dVar12;
    plVar14[4] = lVar13;
    uVar8 = archive_entry_nlink(entry);
    *(uint *)(plVar14 + 2) = uVar8 - 1;
    pcVar9 = archive_entry_pathname(entry);
    pcVar9 = strdup(pcVar9);
    plVar14[5] = (long)pcVar9;
    if (pcVar9 != (char *)0x0) {
      return iVar4;
    }
  }
  archive_set_error(&a->archive,0xc,"Out of memory adding file to list");
  return -0x1e;
}

Assistant:

static int
archive_read_format_cpio_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct cpio *cpio;
	const void *h, *hl;
	struct archive_string_conv *sconv;
	size_t namelength;
	size_t name_pad;
	int r;

	cpio = (struct cpio *)(a->format->data);
	sconv = cpio->opt_sconv;
	if (sconv == NULL) {
		if (!cpio->init_default_conversion) {
			cpio->sconv_default =
			    archive_string_default_conversion_for_read(
			      &(a->archive));
			cpio->init_default_conversion = 1;
		}
		sconv = cpio->sconv_default;
	}
	
	r = (cpio->read_header(a, cpio, entry, &namelength, &name_pad));

	if (r < ARCHIVE_WARN)
		return (r);

	/* Read name from buffer. */
	h = __archive_read_ahead(a, namelength + name_pad, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);
	if (archive_entry_copy_pathname_l(entry,
	    (const char *)h, namelength, sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname can't be converted from %s to current locale.",
		    archive_string_conversion_charset_name(sconv));
		r = ARCHIVE_WARN;
	}
	cpio->entry_offset = 0;

	__archive_read_consume(a, namelength + name_pad);

	/* If this is a symlink, read the link contents. */
	if (archive_entry_filetype(entry) == AE_IFLNK) {
		if (cpio->entry_bytes_remaining > 1024 * 1024) {
			archive_set_error(&a->archive, ENOMEM,
			    "Rejecting malformed cpio archive: symlink contents exceed 1 megabyte");
			return (ARCHIVE_FATAL);
		}
		hl = __archive_read_ahead(a,
			(size_t)cpio->entry_bytes_remaining, NULL);
		if (hl == NULL)
			return (ARCHIVE_FATAL);
		if (archive_entry_copy_symlink_l(entry, (const char *)hl,
		    (size_t)cpio->entry_bytes_remaining, sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Linkname can't be converted from %s to "
			    "current locale.",
			    archive_string_conversion_charset_name(sconv));
			r = ARCHIVE_WARN;
		}
		__archive_read_consume(a, cpio->entry_bytes_remaining);
		cpio->entry_bytes_remaining = 0;
	}

	/* XXX TODO: If the full mode is 0160200, then this is a Solaris
	 * ACL description for the following entry.  Read this body
	 * and parse it as a Solaris-style ACL, then read the next
	 * header.  XXX */

	/* Compare name to "TRAILER!!!" to test for end-of-archive. */
	if (namelength == 11 && strncmp((const char *)h, "TRAILER!!!",
	    10) == 0) {
		/* TODO: Store file location of start of block. */
		archive_clear_error(&a->archive);
		return (ARCHIVE_EOF);
	}

	/* Detect and record hardlinks to previously-extracted entries. */
	if (record_hardlink(a, cpio, entry) != ARCHIVE_OK) {
		return (ARCHIVE_FATAL);
	}

	return (r);
}